

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::LogFinish(void)

{
  FILE *__stream;
  char *pcVar1;
  _func_void_void_ptr_char_ptr *p_Var2;
  ImGuiContext *pIVar3;
  
  pIVar3 = GImGui;
  if (GImGui->LogEnabled == true) {
    LogText("\n");
    __stream = (FILE *)pIVar3->LogFile;
    if (__stream != (FILE *)0x0) {
      if (__stream == _stdout) {
        fflush(__stream);
      }
      else {
        fclose(__stream);
      }
      pIVar3->LogFile = (FILE *)0x0;
    }
    pcVar1 = (pIVar3->LogClipboard).Buf.Data;
    if ((pcVar1 != (char *)0x0) && (2 < (pIVar3->LogClipboard).Buf.Size)) {
      p_Var2 = (GImGui->IO).SetClipboardTextFn;
      if (p_Var2 != (_func_void_void_ptr_char_ptr *)0x0) {
        (*p_Var2)((GImGui->IO).ClipboardUserData,pcVar1);
      }
      ImGuiTextBuffer::clear(&pIVar3->LogClipboard);
    }
    pIVar3->LogEnabled = false;
  }
  return;
}

Assistant:

void ImGui::LogFinish()
{
    ImGuiContext& g = *GImGui;
    if (!g.LogEnabled)
        return;

    LogText(IM_NEWLINE);
    if (g.LogFile != NULL)
    {
        if (g.LogFile == stdout)
            fflush(g.LogFile);
        else
            fclose(g.LogFile);
        g.LogFile = NULL;
    }
    if (g.LogClipboard.size() > 1)
    {
        SetClipboardText(g.LogClipboard.begin());
        g.LogClipboard.clear();
    }
    g.LogEnabled = false;
}